

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void __thiscall psy::C::Scope::Scope(Scope *this,ScopeKind scopeK)

{
  ScopeKind scopeK_local;
  Scope *this_local;
  
  this->_vptr_Scope = (_func_int **)&PTR__Scope_00734c78;
  this->scopeK_ = scopeK;
  this->outerScope_ = (Scope *)0x0;
  std::
  unordered_map<std::pair<const_psy::C::Identifier_*,_psy::C::NameSpace>,_const_psy::C::DeclarationSymbol_*,_std::hash<std::pair<const_psy::C::Identifier_*,_psy::C::NameSpace>_>,_std::equal_to<std::pair<const_psy::C::Identifier_*,_psy::C::NameSpace>_>,_std::allocator<std::pair<const_std::pair<const_psy::C::Identifier_*,_psy::C::NameSpace>,_const_psy::C::DeclarationSymbol_*>_>_>
  ::unordered_map(&this->decls_);
  return;
}

Assistant:

Scope::Scope(ScopeKind scopeK)
    : scopeK_(scopeK)
    , outerScope_(nullptr)
{}